

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout_p.h
# Opt level: O0

void __thiscall
QToolBarAreaLayoutItem::extendSize(QToolBarAreaLayoutItem *this,Orientation o,int extent)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int in_EDX;
  Orientation in_ESI;
  long in_RDI;
  long in_FS_OFFSET;
  int sizeh;
  int newSize;
  undefined4 in_stack_ffffffffffffffa8;
  Orientation in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  Orientation o_00;
  int local_18;
  QSize local_14;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  o_00 = in_ESI;
  local_14 = minimumSize((QToolBarAreaLayoutItem *)CONCAT44(in_ESI,in_stack_ffffffffffffffb0));
  local_c = pick(o_00,(QSize *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  if (*(int *)(in_RDI + 0x10) < 1) {
    in_stack_ffffffffffffffac = in_ESI;
    sizeHint((QToolBarAreaLayoutItem *)CONCAT44(o_00,in_stack_ffffffffffffffb0));
    iVar2 = pick(o_00,(QSize *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  }
  else {
    iVar2 = *(int *)(in_RDI + 0x10);
  }
  local_18 = iVar2 + in_EDX;
  piVar3 = qMax<int>(&local_c,&local_18);
  iVar1 = *piVar3;
  sizeHint((QToolBarAreaLayoutItem *)CONCAT44(o_00,iVar2));
  iVar2 = pick(o_00,(QSize *)CONCAT44(in_stack_ffffffffffffffac,in_ESI));
  if (iVar1 == iVar2) {
    *(undefined4 *)(in_RDI + 0x10) = 0xffffffff;
    *(int *)(in_RDI + 0xc) = iVar2;
  }
  else {
    *(int *)(in_RDI + 0x10) = iVar1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void extendSize(Qt::Orientation o, int extent)
    {
        int newSize = qMax(pick(o, minimumSize()), (preferredSize > 0 ? preferredSize : pick(o, sizeHint())) + extent);
        int sizeh = pick(o, sizeHint());
        if (newSize == sizeh) {
            preferredSize = -1;
            size = sizeh;
        } else {
            preferredSize = newSize;
        }
    }